

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiViewportP::~ImGuiViewportP(ImGuiViewportP *this)

{
  long in_RDI;
  ImDrawDataBuilder *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x30) != 0) {
    IM_DELETE<ImDrawList>((ImDrawList *)0x1543f8);
  }
  if (*(long *)(in_RDI + 0x38) != 0) {
    IM_DELETE<ImDrawList>((ImDrawList *)0x154416);
  }
  ImDrawDataBuilder::~ImDrawDataBuilder(unaff_retaddr);
  return;
}

Assistant:

~ImGuiViewportP()               { if (DrawLists[0]) IM_DELETE(DrawLists[0]); if (DrawLists[1]) IM_DELETE(DrawLists[1]); }